

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O3

void __thiscall
CLI::IsMember::
IsMember<std::unordered_map<std::__cxx11::string,int,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>const*>
          (IsMember *this,
          unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          **set,filter_fn_t *filter_fn_1,filter_fn_t *filter_fn_2)

{
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *set_00;
  _Any_data local_60;
  code *local_50;
  _Any_data local_40;
  code *local_30;
  
  set_00 = *set;
  std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  ::function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
              *)&local_60,filter_fn_1);
  std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  ::function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
              *)&local_40,filter_fn_2);
  IsMember<std::unordered_map<std::__cxx11::string,int,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>const*,CLI::IsMember::unordered_map<std::unordered_map<std::__cxx11::string,int,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>const*>(std::unordered_map<std::__cxx11::string,int,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>const*&&,std::function<std::__cxx11::string(std::__cxx11::string)>,std::function<std::__cxx11::string(std::__cxx11::string)>)::_lambda(std::__cxx11::string)_1_>
            (this,set_00,(anon_class_64_2_53a4bb40 *)&local_60);
  if (local_30 != (code *)0x0) {
    (*local_30)(&local_40,&local_40,__destroy_functor);
  }
  if (local_50 != (code *)0x0) {
    (*local_50)(&local_60,&local_60,__destroy_functor);
  }
  return;
}

Assistant:

IsMember(T &&set, filter_fn_t filter_fn_1, filter_fn_t filter_fn_2, Args &&...other)
        : IsMember(
              std::forward<T>(set),
              [filter_fn_1, filter_fn_2](std::string a) { return filter_fn_2(filter_fn_1(a)); },
              other...) {}